

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_MuxCreate(Str_Mux_t *pTree,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,
                  int nLutSize)

{
  int iVar1;
  int iVar2;
  Str_Obj_t *pObj;
  Str_Obj_t *pSVar3;
  long lVar4;
  Str_Edg_t *pSVar5;
  Str_Edg_t *pSVar6;
  int i;
  long lVar7;
  
  if (nMuxes < 2) {
    __assert_fail("nMuxes >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                  ,0x5db,"void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)")
    ;
  }
  iVar1 = 0;
  memset(pTree,0,((ulong)(uint)nMuxes + 1) * 0x40);
  pTree->nLutSize = nLutSize;
  pTree->Edge[0].Fan = 1;
  pSVar5 = pTree[1].Edge;
  lVar4 = 1;
  while( true ) {
    if (lVar4 == (ulong)(uint)nMuxes + 1) {
      return;
    }
    pTree[lVar4].Id = (int)lVar4;
    pTree[lVar4].nLutSize = nLutSize;
    pTree[lVar4].Delay = -1;
    pTree[lVar4].Copy = -1;
    pObj = Str_NtkObj(pNtk,(nMuxes + iMux) - (int)lVar4);
    if (((undefined1  [16])*pObj & (undefined1  [16])0xf) != (undefined1  [16])0x5) break;
    pSVar6 = pSVar5;
    for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
      i = (int)lVar7;
      iVar2 = Str_ObjFaninC(pNtk,pObj,i);
      pSVar6->fCompl = iVar2;
      iVar2 = Str_ObjFaninId(pNtk,pObj,i);
      if (iVar2 < iMux) {
        pSVar6->Fan = -iVar1;
        pSVar3 = Str_ObjFanin(pNtk,pObj,i);
        iVar2 = pSVar3->iCopy;
        pSVar6->Copy = iVar2;
        iVar2 = Abc_Lit2Var(iVar2);
        iVar2 = Vec_IntEntry(vDelay,iVar2);
        pSVar6->FanDel = iVar2;
        iVar1 = iVar1 + 1;
      }
      else {
        iVar2 = Str_ObjFaninId(pNtk,pObj,i);
        pSVar6->Fan = (nMuxes + iMux) - iVar2;
      }
      pSVar6 = pSVar6 + 1;
    }
    lVar4 = lVar4 + 1;
    pSVar5 = pSVar5 + 4;
  }
  __assert_fail("pObj->Type == STR_MUX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                ,0x5e7,"void Str_MuxCreate(Str_Mux_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int)");
}

Assistant:

void Str_MuxCreate( Str_Mux_t * pTree, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize )
{
    Str_Obj_t * pObj;
    Str_Mux_t * pMux;
    int i, k, nPis = 0;
    assert( nMuxes >= 2 );
    memset( pTree, 0, sizeof(Str_Mux_t) * (nMuxes + 1) );
    pTree->nLutSize = nLutSize;
    pTree->Edge[0].Fan = 1;
    for ( i = 1; i <= nMuxes; i++ )
    {
        pMux = pTree + i;
        pMux->Id = i;
        pMux->nLutSize = nLutSize;
        pMux->Delay = pMux->Copy = -1;
        // assign fanins
        pObj = Str_NtkObj( pNtk, iMux + nMuxes - i );
        assert( pObj->Type == STR_MUX );
        for ( k = 0; k < 3; k++ )
        {
            pMux->Edge[k].fCompl = Str_ObjFaninC(pNtk, pObj, k);
            if ( Str_ObjFaninId(pNtk, pObj, k) >= iMux )
                pMux->Edge[k].Fan = iMux + nMuxes - Str_ObjFaninId(pNtk, pObj, k);
            else
            {
                pMux->Edge[k].Fan = -nPis++; // count external inputs, including controls
                pMux->Edge[k].Copy = Str_ObjFanin(pNtk, pObj, k)->iCopy;
                pMux->Edge[k].FanDel = Vec_IntEntry( vDelay, Abc_Lit2Var(pMux->Edge[k].Copy) );
            }
        }
    }
}